

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

void concat(char *s1,char *s2,char *s3)

{
  char cVar1;
  int local_80;
  int local_7c;
  int j;
  int i;
  string t;
  char *s3_local;
  char *s2_local;
  char *s1_local;
  
  for (local_7c = 0; cVar1 = s1[local_7c], *(char *)((long)&j + (long)local_7c) = cVar1,
      cVar1 != '\0'; local_7c = local_7c + 1) {
  }
  local_80 = local_7c;
  while (cVar1 = s2[local_80 - local_7c], *(char *)((long)&j + (long)local_80) = cVar1,
        cVar1 != '\0') {
    local_80 = local_80 + 1;
  }
  *(undefined1 *)((long)&j + (long)local_80) = 0;
  for (local_7c = 0; local_7c <= local_80; local_7c = local_7c + 1) {
    s3[local_7c] = *(char *)((long)&j + (long)local_7c);
  }
  return;
}

Assistant:

void concat(s1,s2,s3)
string s1, s2, s3 ;

{ string t ;
  int i, j ;

  for (i = 0 ; (t[i] = s1[i]) != '\0' ; i++) ;
  for (j = i ; (t[j] = s2[j - i]) != '\0' ; j++) ;
  t[j] = '\0' ;
  for (i = 0 ; i <= j ; i++) {
    s3[i] = t[i] ;
  }
}